

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

char * fixup_appl(char *appl)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar2 = strrchr(appl,0x5c);
  pcVar5 = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = appl;
  }
  pcVar3 = strrchr(pcVar5,0x2f);
  pcVar2 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar2 = pcVar5;
  }
  sVar4 = strlen(pcVar2);
  pcVar5 = pcVar2 + (sVar4 - 4);
  iVar1 = strcmp(pcVar5,".exe");
  if ((iVar1 != 0) && (iVar1 = strcmp(pcVar5,".EXE"), iVar1 != 0)) {
    return pcVar2;
  }
  *pcVar5 = '\0';
  return pcVar2;
}

Assistant:

const char *fixup_appl(char *appl)
{
    char *applp;

    /* strip pathprefix from appl */
    applp = strrchr(appl, '\\');
    if (applp != NULL)
    {
        appl = applp + 1;
    }
    applp = strrchr(appl, '/');
    if (applp != NULL)
    {
        appl = applp + 1;
    }
    /* strip possible exe suffix */
    applp = appl + strlen(appl) - 4;
    if(strcmp(applp, ".exe") == 0 || strcmp(applp, ".EXE") == 0)
    {
        *applp = '\0';
    }
    return appl;
}